

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# nuklear.h
# Opt level: O0

void nk_zero(void *ptr,nk_size size)

{
  nk_size size_local;
  void *ptr_local;
  
  if (ptr != (void *)0x0) {
    nk_memset(ptr,0,size);
    return;
  }
  __assert_fail("ptr",
                "/workspace/llm4binary/github/license_all_cmakelists_25/Rodousse[P]SSSGems/third_party/glfw/deps/nuklear.h"
                ,0x18db,"void nk_zero(void *, nk_size)");
}

Assistant:

NK_LIB void
nk_zero(void *ptr, nk_size size)
{
    NK_ASSERT(ptr);
    NK_MEMSET(ptr, 0, size);
}